

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O0

ggml_tensor * __thiscall
test_conv_transpose_1d::build_graph(test_conv_transpose_1d *this,ggml_context *ctx)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  int64_t *in_RSI;
  long in_RDI;
  ggml_tensor *out;
  ggml_tensor *kernel;
  ggml_tensor *input;
  int64_t *in_stack_ffffffffffffffc8;
  int64_t *ne;
  ggml_context *in_stack_ffffffffffffffd8;
  test_case *in_stack_ffffffffffffffe0;
  
  std::array<long,_4UL>::data((array<long,_4UL> *)0x14886b);
  pgVar1 = test_case::ggml_new_tensor
                     (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                      (ggml_type)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffffc8);
  ggml_set_name(pgVar1,"input");
  ne = in_RSI;
  std::array<long,_4UL>::data((array<long,_4UL> *)0x1488b2);
  pgVar2 = test_case::ggml_new_tensor
                     (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                      (ggml_type)((ulong)in_RDI >> 0x20),(int)in_RDI,ne);
  ggml_set_name(pgVar2,"kernel");
  pgVar1 = (ggml_tensor *)
           ggml_conv_transpose_1d
                     (in_RSI,pgVar2,pgVar1,*(undefined4 *)(in_RDI + 0x78),
                      *(undefined4 *)(in_RDI + 0x7c),*(undefined4 *)(in_RDI + 0x80));
  ggml_set_name(pgVar1,"out");
  return pgVar1;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * input = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne_input.data());
        ggml_set_name(input, "input");

        ggml_tensor * kernel = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne_kernel.data());
        ggml_set_name(kernel, "kernel");

        ggml_tensor * out = ggml_conv_transpose_1d(ctx, kernel, input, s0, p0, d0);
        ggml_set_name(out, "out");

        return out;
    }